

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

Socket * sk_newlistener(char *srcaddr,int port,Plug *plug,_Bool param_4,int orig_address_family)

{
  bool bVar1;
  int fd;
  int iVar2;
  int iVar3;
  NetSocket *s;
  char *pcVar4;
  Socket *pSVar5;
  int *piVar6;
  socklen_t __len;
  int __domain;
  sockaddr *__addr;
  Socket *pSVar7;
  addrinfo *ai;
  int on;
  char portstr [6];
  sockaddr_union u;
  addrinfo *local_118;
  int local_10c;
  int local_108;
  undefined4 local_104;
  Socket *local_100;
  Plug *local_f8;
  char local_ee [6];
  addrinfo local_e8;
  sockaddr local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  __domain = 0;
  local_118 = (addrinfo *)0x0;
  local_104 = 1;
  s = (NetSocket *)safemalloc(1,0x98,0);
  (s->sock).vt = &NetSocket_sockvt;
  s->error = (char *)0x0;
  s->plug = plug;
  bufchain_init(&s->output_data);
  s->writable = false;
  s->frozen = false;
  s->sending_oob = 0;
  s->localhost_only = param_4;
  s->pending_error = 0;
  s->oobpending = false;
  s->outgoingeof = EOF_NO;
  s->incomingeof = false;
  s->parent = (NetSocket *)0x0;
  s->child = (NetSocket *)0x0;
  s->listener = true;
  s->addr = (SockAddr *)0x0;
  if (orig_address_family == 2) {
    __domain = 10;
  }
  if (orig_address_family == 1) {
    __domain = 2;
  }
  s->s = -1;
  if (__domain == 0) {
    __domain = 10;
  }
  local_108 = orig_address_family;
  fd = socket(__domain,1,0);
  if (__domain == 10 && fd < 0) {
    fd = socket(2,1,0);
    __domain = 2;
  }
  pSVar7 = &s->sock;
  if (-1 < fd) {
    cloexec(fd);
    s->oobinline = false;
    iVar2 = setsockopt(fd,1,2,&local_104,4);
    if (iVar2 < 0) {
      piVar6 = __errno_location();
      pcVar4 = strerror(*piVar6);
      s->error = pcVar4;
      close(fd);
      return pSVar7;
    }
    __len = 0xffffffff;
    local_10c = port;
    local_f8 = plug;
    if (srcaddr == (char *)0x0) {
      __addr = (sockaddr *)0x0;
      bVar1 = false;
    }
    else {
      local_e8.ai_flags = 4;
      local_e8.ai_socktype = 1;
      local_e8.ai_protocol = 0;
      local_e8.ai_addrlen = 0;
      local_e8.ai_addr = (sockaddr *)0x0;
      local_e8.ai_canonname = (char *)0x0;
      local_e8.ai_next = (addrinfo *)0x0;
      local_100 = pSVar7;
      local_e8.ai_family = __domain;
      if (99999 < (uint)port) {
        __assert_fail("port >= 0 && port <= 99999",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                      ,0x37c,"Socket *sk_newlistener(const char *, int, Plug *, _Bool, int)");
      }
      bVar1 = false;
      sprintf(local_ee,"%d",(ulong)(uint)port);
      pcVar4 = host_strduptrim(srcaddr);
      iVar2 = getaddrinfo(pcVar4,local_ee,&local_e8,&local_118);
      safefree(pcVar4);
      pSVar7 = local_100;
      if (iVar2 == 0) {
        __addr = local_118->ai_addr;
        __len = local_118->ai_addrlen;
        bVar1 = true;
      }
      else {
        __addr = (sockaddr *)0x0;
        __len = 0xffffffff;
      }
    }
    iVar2 = local_10c;
    if (!bVar1) {
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8.sa_data[6] = '\0';
      local_b8.sa_data[7] = '\0';
      local_b8.sa_data[8] = '\0';
      local_b8.sa_data[9] = '\0';
      local_b8.sa_data[10] = '\0';
      local_b8.sa_data[0xb] = '\0';
      local_b8.sa_data[0xc] = '\0';
      local_b8.sa_data[0xd] = '\0';
      local_b8.sa_data._0_2_ = (ushort)local_10c << 8 | (ushort)local_10c >> 8;
      if (__domain == 10) {
        local_b8.sa_family = 10;
        local_b8.sa_data._2_4_ = 0;
        if (param_4) {
          pcVar4 = &in6addr_loopback;
        }
        else {
          pcVar4 = &in6addr_any;
        }
        local_b8.sa_data._6_8_ = *(undefined8 *)pcVar4;
        local_a8 = *(undefined8 *)(pcVar4 + 8);
        __addr = &local_b8;
        __len = 0x1c;
      }
      else {
        local_b8.sa_family = 2;
        if (param_4) {
          local_b8.sa_data._2_4_ = 0x100007f;
        }
        else {
          local_b8.sa_data._2_4_ = 0;
        }
        __addr = &local_b8;
        __len = 0x10;
      }
    }
    iVar3 = bind(fd,__addr,__len);
    if (local_118 != (addrinfo *)0x0) {
      freeaddrinfo(local_118);
    }
    if ((-1 < iVar3) && (iVar3 = listen(fd,0x1000), -1 < iVar3)) {
      if ((local_108 == 0) && (__domain == 10)) {
        pSVar5 = sk_newlistener(srcaddr,iVar2,local_f8,param_4,1);
        if (pSVar5[-0x12].vt != (SocketVtable *)0x0) {
          close(fd);
          safefree(s);
          return pSVar5;
        }
        pSVar5[-2].vt = (SocketVtable *)s;
        s->child = (NetSocket *)(pSVar5 + -0x12);
      }
      s->s = fd;
      uxsel_tell(s);
      add234(sktree,s);
      return pSVar7;
    }
    close(fd);
  }
  piVar6 = __errno_location();
  pcVar4 = strerror(*piVar6);
  s->error = pcVar4;
  return pSVar7;
}

Assistant:

Socket *sk_newlistener(const char *srcaddr, int port, Plug *plug,
                       bool local_host_only, int orig_address_family)
{
    int s;
#ifndef NO_IPV6
    struct addrinfo hints, *ai = NULL;
    char portstr[6];
#endif
    union sockaddr_union u;
    union sockaddr_union *addr;
    int addrlen;
    NetSocket *ret;
    int retcode;
    int address_family;
    int on = 1;

    /*
     * Create NetSocket structure.
     */
    ret = snew(NetSocket);
    ret->sock.vt = &NetSocket_sockvt;
    ret->error = NULL;
    ret->plug = plug;
    bufchain_init(&ret->output_data);
    ret->writable = false;             /* to start with */
    ret->sending_oob = 0;
    ret->frozen = false;
    ret->localhost_only = local_host_only;
    ret->pending_error = 0;
    ret->parent = ret->child = NULL;
    ret->oobpending = false;
    ret->outgoingeof = EOF_NO;
    ret->incomingeof = false;
    ret->listener = true;
    ret->addr = NULL;
    ret->s = -1;

    /*
     * Translate address_family from platform-independent constants
     * into local reality.
     */
    address_family = (orig_address_family == ADDRTYPE_IPV4 ? AF_INET :
#ifndef NO_IPV6
                      orig_address_family == ADDRTYPE_IPV6 ? AF_INET6 :
#endif
                      AF_UNSPEC);

#ifndef NO_IPV6
    /* Let's default to IPv6.
     * If the stack doesn't support IPv6, we will fall back to IPv4. */
    if (address_family == AF_UNSPEC) address_family = AF_INET6;
#else
    /* No other choice, default to IPv4 */
    if (address_family == AF_UNSPEC)  address_family = AF_INET;
#endif

    /*
     * Open socket.
     */
    s = socket(address_family, SOCK_STREAM, 0);

#ifndef NO_IPV6
    /* If the host doesn't support IPv6 try fallback to IPv4. */
    if (s < 0 && address_family == AF_INET6) {
        address_family = AF_INET;
        s = socket(address_family, SOCK_STREAM, 0);
    }
#endif

    if (s < 0) {
        ret->error = strerror(errno);
        return &ret->sock;
    }

    cloexec(s);

    ret->oobinline = false;

    if (setsockopt(s, SOL_SOCKET, SO_REUSEADDR,
                   (const char *)&on, sizeof(on)) < 0) {
        ret->error = strerror(errno);
        close(s);
        return &ret->sock;
    }

    retcode = -1;
    addr = NULL; addrlen = -1;         /* placate optimiser */

    if (srcaddr != NULL) {
#ifndef NO_IPV6
        hints.ai_flags = AI_NUMERICHOST;
        hints.ai_family = address_family;
        hints.ai_socktype = SOCK_STREAM;
        hints.ai_protocol = 0;
        hints.ai_addrlen = 0;
        hints.ai_addr = NULL;
        hints.ai_canonname = NULL;
        hints.ai_next = NULL;
        assert(port >= 0 && port <= 99999);
        sprintf(portstr, "%d", port);
        {
            char *trimmed_addr = host_strduptrim(srcaddr);
            retcode = getaddrinfo(trimmed_addr, portstr, &hints, &ai);
            sfree(trimmed_addr);
        }
        if (retcode == 0) {
            addr = (union sockaddr_union *)ai->ai_addr;
            addrlen = ai->ai_addrlen;
        }
#else
        memset(&u,'\0',sizeof u);
        u.sin.sin_family = AF_INET;
        u.sin.sin_port = htons(port);
        u.sin.sin_addr.s_addr = inet_addr(srcaddr);
        if (u.sin.sin_addr.s_addr != (in_addr_t)(-1)) {
            /* Override localhost_only with specified listen addr. */
            ret->localhost_only = ipv4_is_loopback(u.sin.sin_addr);
        }
        addr = &u;
        addrlen = sizeof(u.sin);
        retcode = 0;
#endif
    }

    if (retcode != 0) {
        memset(&u,'\0',sizeof u);
#ifndef NO_IPV6
        if (address_family == AF_INET6) {
            u.sin6.sin6_family = AF_INET6;
            u.sin6.sin6_port = htons(port);
            if (local_host_only)
                u.sin6.sin6_addr = in6addr_loopback;
            else
                u.sin6.sin6_addr = in6addr_any;
            addr = &u;
            addrlen = sizeof(u.sin6);
        } else
#endif
        {
            u.sin.sin_family = AF_INET;
            u.sin.sin_port = htons(port);
            if (local_host_only)
                u.sin.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
            else
                u.sin.sin_addr.s_addr = htonl(INADDR_ANY);
            addr = &u;
            addrlen = sizeof(u.sin);
        }
    }

    retcode = bind(s, &addr->sa, addrlen);

#ifndef NO_IPV6
    if (ai)
        freeaddrinfo(ai);
#endif

    if (retcode < 0) {
        close(s);
        ret->error = strerror(errno);
        return &ret->sock;
    }

    if (listen(s, SOMAXCONN) < 0) {
        close(s);
        ret->error = strerror(errno);
        return &ret->sock;
    }

#ifndef NO_IPV6
    /*
     * If we were given ADDRTYPE_UNSPEC, we must also create an
     * IPv4 listening socket and link it to this one.
     */
    if (address_family == AF_INET6 && orig_address_family == ADDRTYPE_UNSPEC) {
        NetSocket *other;

        other = container_of(
            sk_newlistener(srcaddr, port, plug,
                           local_host_only, ADDRTYPE_IPV4),
            NetSocket, sock);

        if (other) {
            if (!other->error) {
                other->parent = ret;
                ret->child = other;
            } else {
                /* If we couldn't create a listening socket on IPv4 as well
                 * as IPv6, we must return an error overall. */
                close(s);
                sfree(ret);
                return &other->sock;
            }
        }
    }
#endif

    ret->s = s;

    uxsel_tell(ret);
    add234(sktree, ret);

    return &ret->sock;
}